

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O1

bool __thiscall
cmUVProcessChain::InternalData::Prepare(InternalData *this,cmUVProcessChainBuilder *builder)

{
  uv_pipe_ptr *puVar1;
  StdioType SVar2;
  cmUVProcessChainBuilder *pcVar3;
  int iVar4;
  uv_stream_t *puVar5;
  uv_loop_t *puVar6;
  uv_pipe_s *handle;
  bool bVar7;
  int pipeFd [2];
  uv_file local_20;
  int local_1c;
  
  this->Builder = builder;
  SVar2 = (builder->Stdio)._M_elems[1].Type;
  if (SVar2 == External) {
    (this->OutputStreamData).super_BasicStreamData.Stdio.flags = UV_INHERIT_FD;
    (this->OutputStreamData).super_BasicStreamData.Stdio.data.fd =
         (builder->Stdio)._M_elems[1].FileDescriptor;
  }
  else if (SVar2 == Builtin) {
    puVar1 = &(this->OutputStreamData).super_BasicStreamData.BuiltinStream;
    puVar6 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
    ::cm::uv_pipe_ptr::init(puVar1,(EVP_PKEY_CTX *)puVar6);
    (this->OutputStreamData).super_BasicStreamData.Stdio.flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
    puVar5 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(puVar1);
    (this->OutputStreamData).super_BasicStreamData.Stdio.data.stream = puVar5;
  }
  else if (SVar2 == None) {
    (this->OutputStreamData).super_BasicStreamData.Stdio.flags = UV_IGNORE;
  }
  pcVar3 = this->Builder;
  SVar2 = (pcVar3->Stdio)._M_elems[2].Type;
  bVar7 = true;
  if (SVar2 == External) {
    (this->ErrorStreamData).super_BasicStreamData.Stdio.flags = UV_INHERIT_FD;
    local_1c = (pcVar3->Stdio)._M_elems[2].FileDescriptor;
LAB_00531ca3:
    (this->ErrorStreamData).super_BasicStreamData.Stdio.data.fd = local_1c;
  }
  else {
    if (SVar2 != Builtin) {
      if (SVar2 != None) {
        return true;
      }
      (this->ErrorStreamData).super_BasicStreamData.Stdio.flags = UV_IGNORE;
      return true;
    }
    iVar4 = cmGetPipes(&local_20);
    if (-1 < iVar4) {
      puVar1 = &(this->ErrorStreamData).super_BasicStreamData.BuiltinStream;
      puVar6 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
      ::cm::uv_pipe_ptr::init(puVar1,(EVP_PKEY_CTX *)puVar6);
      handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                         (&puVar1->super_uv_handle_ptr_<uv_pipe_s>);
      iVar4 = uv_pipe_open(handle,local_20);
      if (-1 < iVar4) {
        (this->ErrorStreamData).super_BasicStreamData.Stdio.flags = UV_INHERIT_FD;
        goto LAB_00531ca3;
      }
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmUVProcessChain::InternalData::Prepare(
  const cmUVProcessChainBuilder* builder)
{
  this->Builder = builder;

  auto const& output =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_OUTPUT];
  auto& outputData = this->OutputStreamData;
  switch (output.Type) {
    case cmUVProcessChainBuilder::None:
      outputData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin:
      outputData.BuiltinStream.init(*this->Loop, 0);
      outputData.Stdio.flags =
        static_cast<uv_stdio_flags>(UV_CREATE_PIPE | UV_WRITABLE_PIPE);
      outputData.Stdio.data.stream = outputData.BuiltinStream;
      break;

    case cmUVProcessChainBuilder::External:
      outputData.Stdio.flags = UV_INHERIT_FD;
      outputData.Stdio.data.fd = output.FileDescriptor;
      break;
  }

  auto const& error =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_ERROR];
  auto& errorData = this->ErrorStreamData;
  switch (error.Type) {
    case cmUVProcessChainBuilder::None:
      errorData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin: {
      int pipeFd[2];
      if (cmGetPipes(pipeFd) < 0) {
        return false;
      }

      errorData.BuiltinStream.init(*this->Loop, 0);
      if (uv_pipe_open(errorData.BuiltinStream, pipeFd[0]) < 0) {
        return false;
      }
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = pipeFd[1];
      break;
    }

    case cmUVProcessChainBuilder::External:
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = error.FileDescriptor;
      break;
  }

  return true;
}